

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *name,string *config)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar4;
  ostream *poVar5;
  string local_4e8;
  cmGeneratorTarget *local_4c8;
  cmGeneratorTarget *tgt;
  iterator __end1;
  iterator __begin1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range1;
  undefined1 local_488 [8];
  ostringstream e;
  string local_310 [8];
  string se;
  cmGeneratedFileStream os;
  undefined1 local_80 [8];
  string fileName;
  undefined1 local_48 [8];
  string cxx_modules_dirname;
  string *config_local;
  string *name_local;
  cmExportBuildFileGenerator *this_local;
  
  cxx_modules_dirname.field_2._8_8_ = config;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])(local_48);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)config,"noconfig");
    }
    os._615_1_ = 0x2f;
    os._614_1_ = 0x2d;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[7]>
              ((string *)local_80,&(this->super_cmExportFileGenerator).FileDir,&os.field_0x267,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (char (*) [14])0x104d299,name,&os.field_0x266,config,(char (*) [7])0x1002046);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),(string *)local_80,true,None);
    bVar1 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    if ((bVar1 & 1) == 0) {
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)((long)&se.field_2 + 8),true);
      this_00 = &(this->super_cmExportFileGenerator).ExportedTargets;
      __end1 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(this_00);
      tgt = (cmGeneratorTarget *)
            std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::end(this_00);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&tgt), bVar2) {
        ppcVar4 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end1);
        local_4c8 = *ppcVar4;
        bVar2 = cmGeneratorTarget::HaveCxx20ModuleSources(local_4c8,(string *)0x0);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)((long)&se.field_2 + 8),
                                   "include(\"${CMAKE_CURRENT_LIST_DIR}/target-");
          cmGeneratorTarget::GetExportName_abi_cxx11_(&local_4e8,local_4c8);
          poVar5 = std::operator<<(poVar5,(string *)&local_4e8);
          poVar5 = std::operator<<(poVar5,'-');
          poVar5 = std::operator<<(poVar5,(string *)config);
          std::operator<<(poVar5,".cmake\")\n");
          std::__cxx11::string::~string((string *)&local_4e8);
        }
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end1);
      }
      this_local._7_1_ = true;
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
      poVar5 = std::operator<<((ostream *)local_488,"cannot write to file \"");
      poVar5 = std::operator<<(poVar5,(string *)local_80);
      poVar5 = std::operator<<(poVar5,"\": ");
      std::operator<<(poVar5,local_310);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
      std::__cxx11::string::~string(local_310);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string const& name, std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, "/cxx-modules-", name,
             '-', config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}